

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmake.cpp
# Opt level: O2

void __thiscall
CTcMake::build_symbol_file
          (CTcMake *this,CTcHostIfc *hostifc,CResLoader *res_loader,textchar_t *src_fname,
          textchar_t *sym_fname,CTcMakeModule *src_mod,int *error_count,int *warning_count)

{
  CTcMain *this_00;
  err_frame_t *peVar1;
  CVmException *pCVar2;
  int err;
  undefined8 *puVar3;
  long *plVar4;
  size_t sVar5;
  FILE *pFVar6;
  char *pcVar7;
  char *name;
  CVmFile *fp;
  err_frame_t err_cur__;
  
  fp = (CVmFile *)0x0;
  puVar3 = (undefined8 *)_ZTW11G_err_frame();
  err_cur__.prv_ = (err_frame_t *)*puVar3;
  plVar4 = (long *)_ZTW11G_err_frame();
  *plVar4 = (long)&err_cur__;
  err_cur__.state_ = _setjmp((__jmp_buf_tag *)err_cur__.jmpbuf_);
  if (err_cur__.state_ == 0) {
    CTcMain::init((EVP_PKEY_CTX *)hostifc);
    set_compiler_options(this);
    pcVar7 = (src_mod->orig_name_).buf_;
    if (pcVar7 == (char *)0x0) {
      pcVar7 = "";
    }
    err = CTcTokenizer::set_source(G_tok,src_fname,pcVar7);
    this_00 = G_tcmain;
    if (err == 0) {
      G_prs->field_0xec = G_prs->field_0xec | 4;
      CTcTokenizer::next(G_tok);
      pcVar7 = (src_mod->orig_name_).buf_;
      name = "";
      if (pcVar7 != (char *)0x0) {
        name = pcVar7;
      }
      CTcParser::set_module_info(G_prs,name,src_mod->seqno_);
      CTcParser::set_source_text_group_mode(G_prs,this->src_group_mode_);
      CTcParser::parse_top(G_prs);
      if (G_tcmain->error_count_ == 0) {
        pFVar6 = fopen(sym_fname,"wb");
        if (pFVar6 == (FILE *)0x0) {
          CTcMain::log_error(G_tcmain,(CTcTokFileDesc *)0x0,0,TC_SEV_ERROR,0x2968,sym_fname);
        }
        else {
          fp = (CVmFile *)operator_new(0x10);
          fp->fp_ = (osfildef *)0x0;
          fp->seek_base_ = 0;
          fp->fp_ = (osfildef *)pFVar6;
          fp->seek_base_ = 0;
          CTcParser::write_symbol_file(G_prs,fp,this);
        }
      }
    }
    else {
      sVar5 = strlen(src_fname);
      CTcMain::log_error(this_00,(CTcTokFileDesc *)0x0,0,TC_SEV_ERROR,err,sVar5 & 0xffffffff,
                         src_fname);
    }
  }
  if (-1 < (short)err_cur__.state_) {
    err_cur__.state_ = err_cur__.state_ | 0x8000;
    *error_count = *error_count + G_tcmain->error_count_;
    *warning_count = *warning_count + G_tcmain->warning_count_;
    if (fp != (CVmFile *)0x0) {
      if (fp != (CVmFile *)0x0) {
        CVmFile::~CVmFile(fp);
      }
      operator_delete(fp,0x10);
    }
    if ((*error_count != 0) || ((this->warnings_as_errors_ != 0 && (*warning_count != 0)))) {
      remove(sym_fname);
    }
    CTcMain::terminate();
  }
  peVar1 = err_cur__.prv_;
  puVar3 = (undefined8 *)_ZTW11G_err_frame();
  *puVar3 = peVar1;
  if ((err_cur__.state_ & 0x4001U) != 0) {
    puVar3 = (undefined8 *)_ZTW11G_err_frame();
    if ((*(byte *)*puVar3 & 2) != 0) {
      plVar4 = (long *)_ZTW11G_err_frame();
      free(*(void **)(*plVar4 + 0x10));
    }
    pCVar2 = err_cur__.exc_;
    plVar4 = (long *)_ZTW11G_err_frame();
    *(CVmException **)(*plVar4 + 0x10) = pCVar2;
    err_rethrow();
  }
  if ((err_cur__.state_ & 2U) != 0) {
    free(err_cur__.exc_);
  }
  return;
}

Assistant:

void CTcMake::build_symbol_file(CTcHostIfc *hostifc,
                                CResLoader *res_loader,
                                const textchar_t *src_fname,
                                const textchar_t *sym_fname,
                                CTcMakeModule *src_mod,
                                int *error_count, int *warning_count)
{
    osfildef *fpout;
    CVmFile *volatile fp = 0;

    err_try
    {
        int err;
        
        /* initialize the compiler */
        CTcMain::init(hostifc, res_loader, source_charset_);

        /* set options */
        set_compiler_options();
        
        /* set up the tokenizer with the main input file */
        err = G_tok->set_source(src_fname, src_mod->get_orig_name());
        if (err != 0)
        {
            G_tcmain->log_error(0, 0, TC_SEV_ERROR, err,
                                (int)strlen(src_fname), src_fname);
            goto done;
        }
        
        /* parse in syntax-only mode */
        G_prs->set_syntax_only(TRUE);

        /* read the first token */
        G_tok->next();

        /* give the parser the module information */
        G_prs->set_module_info(
            src_mod->get_orig_name(), src_mod->get_seqno());

        /* set the sourceTextGroup mode */
        G_prs->set_source_text_group_mode(src_group_mode_);

        /* parse at the top level */
        G_prs->parse_top();

        /* if no errors occurred, write the symbol file */
        if (G_tcmain->get_error_count() == 0)
        {
            /* set up the output file */
            fpout = osfopwb(sym_fname, OSFTT3SYM);
            if (fpout == 0)
            {
                G_tcmain->log_error(0, 0, TC_SEV_ERROR,
                                    TCERR_MAKE_CANNOT_CREATE_SYM, sym_fname);
                goto done;
            }
            fp = new CVmFile();
            fp->set_file(fpout, 0);

            /* write the symbol file */
            G_prs->write_symbol_file(fp, this);
        }

    done: ;
    }